

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string *psVar1;
  bool bVar2;
  char *pcVar3;
  istream *piVar4;
  size_type sVar5;
  ostream *poVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  allocator<char> local_499 [17];
  string line;
  string arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  char **local_408;
  char *modulepath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulepaths;
  char *usepath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usepaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  searchpaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  ChaiScript_Basic chai;
  
  local_408 = argv;
  pcVar3 = getenv("CHAI_USE_PATH");
  usepath = pcVar3;
  modulepath = getenv("CHAI_MODULE_PATH");
  usepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  usepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  usepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&usepaths,
             (char (*) [1])0x3f010d);
  if (pcVar3 != (char *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&usepaths,
               &usepath);
  }
  modulepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  modulepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  modulepaths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  default_search_paths_abi_cxx11_();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&modulepaths,
             (const_iterator)
             modulepaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )searchpaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )searchpaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&modulepaths,
             (char (*) [1])0x3f010d);
  if (modulepath != (char *)0x0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&modulepaths,
               &modulepath);
  }
  create_chaiscript_stdlib();
  create_chaiscript_parser();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_388,&modulepaths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3a0,&usepaths);
  chaiscript::default_options();
  chaiscript::ChaiScript_Basic::ChaiScript_Basic
            (&chai,(ModulePtr *)&line,
             (unique_ptr<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
              *)&local_428,&local_388,&local_3a0,
             (vector<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&arg);
  std::_Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_>::~_Vector_base
            ((_Vector_base<chaiscript::Options,_std::allocator<chaiscript::Options>_> *)&arg);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_388);
  if ((long *)local_428._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_428._M_dataplus._M_p + 0x20))();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&line._M_string_length);
  local_428._M_dataplus._M_p = (pointer)myexit;
  chaiscript::
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<void(int),void(*)(int)>,void(*)(int)>
            ((chaiscript *)&line,(_func_void_int **)&local_428);
  std::__cxx11::string::string<std::allocator<char>>((string *)&arg,"exit",local_499);
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (&chai,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&line,&arg);
  std::__cxx11::string::~string((string *)&arg);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&line._M_string_length);
  local_428._M_dataplus._M_p = (pointer)myexit;
  chaiscript::
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<void(int),void(*)(int)>,void(*)(int)>
            ((chaiscript *)&line,(_func_void_int **)&local_428);
  std::__cxx11::string::string<std::allocator<char>>((string *)&arg,"quit",local_499);
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (&chai,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&line,&arg);
  std::__cxx11::string::~string((string *)&arg);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&line._M_string_length);
  local_428._M_dataplus._M_p = (pointer)help;
  chaiscript::
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<void(int),void(*)(int)>,void(*)(int)>
            ((chaiscript *)&line,(_func_void_int **)&local_428);
  std::__cxx11::string::string<std::allocator<char>>((string *)&arg,"help",local_499);
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (&chai,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&line,&arg);
  std::__cxx11::string::~string((string *)&arg);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&line._M_string_length);
  local_428._M_dataplus._M_p = (pointer)throws_exception_abi_cxx11_;
  chaiscript::
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string(std::function<void()>const&),std::__cxx11::string(*)(std::function<void()>const&)>,std::__cxx11::string(*)(std::function<void()>const&)>
            ((chaiscript *)&line,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_function<void_()>_ptr
              **)&local_428);
  std::__cxx11::string::string<std::allocator<char>>((string *)&arg,"throws_exception",local_499);
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (&chai,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&line,&arg);
  std::__cxx11::string::~string((string *)&arg);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&line._M_string_length);
  local_428._M_dataplus._M_p = (pointer)get_eval_error;
  chaiscript::
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::exception::eval_error(std::function<void()>const&),chaiscript::exception::eval_error(*)(std::function<void()>const&)>,chaiscript::exception::eval_error(*)(std::function<void()>const&)>
            ((chaiscript *)&line,(_func_eval_error_function<void_()>_ptr **)&local_428);
  std::__cxx11::string::string<std::allocator<char>>((string *)&arg,"get_eval_error",local_499);
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (&chai,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&line,&arg);
  std::__cxx11::string::~string((string *)&arg);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&line._M_string_length);
  local_428._M_dataplus._M_p = (pointer)now;
  chaiscript::
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<double(),double(*)()>,double(*)()>
            ((chaiscript *)&line,(_func_double **)&local_428);
  std::__cxx11::string::string<std::allocator<char>>((string *)&arg,"now",local_499);
  chaiscript::ChaiScript_Basic::add<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (&chai,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&line,&arg);
  std::__cxx11::string::~string((string *)&arg);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&line._M_string_length);
  iVar9 = 0;
  do {
    if (argc <= iVar9) {
      iVar9 = 0;
LAB_00334d0b:
      chaiscript::ChaiScript_Basic::~ChaiScript_Basic(&chai);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&searchpaths);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&modulepaths);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&usepaths);
      return iVar9;
    }
    iVar8 = iVar9;
    if (iVar9 == 0) {
      iVar8 = 1;
    }
    if (argc < 2) {
      iVar8 = iVar9;
    }
    pcVar3 = "--interactive";
    if (iVar8 != 0) {
      pcVar3 = local_408[iVar8];
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arg,pcVar3,(allocator<char> *)&line);
    bVar2 = std::operator==(&arg,"-c");
    if ((bVar2) || (bVar2 = std::operator==(&arg,"--command"), bVar2)) {
      iVar8 = iVar8 + 1;
      if (argc <= iVar8) {
        pcVar3 = "insufficient input following ";
LAB_00334cda:
        poVar6 = std::operator<<((ostream *)&std::cout,pcVar3);
        poVar6 = std::operator<<(poVar6,(string *)&arg);
        std::operator<<(poVar6,'\n');
        std::__cxx11::string::~string((string *)&arg);
        iVar9 = 1;
        goto LAB_00334d0b;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&arg,local_408[iVar8]);
LAB_00334969:
      local_428._M_dataplus._M_p = (pointer)0x0;
      local_428._M_string_length = 0;
      std::__cxx11::string::string<std::allocator<char>>((string *)&line,"__EVAL__",local_499);
      chaiscript::ChaiScript_Basic::eval
                ((ChaiScript_Basic *)local_360,(string *)&chai,(Exception_Handler *)&arg,&local_428)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_360 + 8));
      std::__cxx11::string::~string((string *)&line);
      psVar1 = &local_428;
LAB_003349c3:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar1->_M_string_length);
    }
    else {
      bVar2 = std::operator==(&arg,"-");
      if ((bVar2) || (bVar2 = std::operator==(&arg,"--stdin"), bVar2)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&arg,"");
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        while (piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)&std::cin,(string *)&line),
              ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
          std::operator+(&local_428,&line,'\n');
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&arg,&local_428);
          std::__cxx11::string::~string((string *)&local_428);
        }
        std::__cxx11::string::~string((string *)&line);
        goto LAB_00334969;
      }
      bVar2 = std::operator==(&arg,"-v");
      pcVar3 = "print(version())";
      if (bVar2) {
LAB_00334961:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (&arg,pcVar3);
        goto LAB_00334969;
      }
      bVar2 = std::operator==(&arg,"--version");
      pcVar3 = "print(version())";
      if (bVar2) goto LAB_00334961;
      bVar2 = std::operator==(&arg,"-h");
      pcVar3 = "help(-1)";
      if (bVar2) goto LAB_00334961;
      bVar2 = std::operator==(&arg,"--help");
      pcVar3 = "help(-1)";
      if (bVar2) goto LAB_00334961;
      bVar2 = std::operator==(&arg,"-e");
      if ((((!bVar2) && (bVar2 = std::operator==(&arg,"--evalerrorok"), !bVar2)) &&
          (bVar2 = std::operator==(&arg,"--exception"), !bVar2)) &&
         (bVar2 = std::operator==(&arg,"--any-exception"), !bVar2)) {
        bVar2 = std::operator==(&arg,"-i");
        if ((bVar2) || (bVar2 = std::operator==(&arg,"--interactive"), bVar2)) {
          interactive(&chai);
          uVar7 = __cxa_rethrow();
          __cxa_end_catch();
          std::__cxx11::string::~string((string *)&arg);
          chaiscript::ChaiScript_Basic::~ChaiScript_Basic(&chai);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&searchpaths);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&modulepaths);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&usepaths);
          _Unwind_Resume(uVar7);
        }
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&arg,'-',0);
        if (sVar5 == 0) {
          pcVar3 = "unrecognised argument ";
          goto LAB_00334cda;
        }
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length = 0;
        chaiscript::ChaiScript_Basic::eval_file
                  ((ChaiScript_Basic *)local_370,(string *)&chai,(Exception_Handler *)&arg);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_370 + 8));
        psVar1 = &line;
        goto LAB_003349c3;
      }
    }
    std::__cxx11::string::~string((string *)&arg);
    iVar9 = iVar8 + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
// Disable deprecation warning for getenv call.
#ifdef CHAISCRIPT_MSVC
#pragma warning(push)
#pragma warning(disable : 4996)
#endif

  const char *usepath = getenv("CHAI_USE_PATH");
  const char *modulepath = getenv("CHAI_MODULE_PATH");

#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif

  std::vector<std::string> usepaths;
  usepaths.emplace_back("");
  if (usepath != nullptr) {
    usepaths.emplace_back(usepath);
  }

  std::vector<std::string> modulepaths;
  std::vector<std::string> searchpaths = default_search_paths();
  modulepaths.insert(modulepaths.end(), searchpaths.begin(), searchpaths.end());
  modulepaths.emplace_back("");
  if (modulepath != nullptr) {
    modulepaths.emplace_back(modulepath);
  }

  chaiscript::ChaiScript_Basic chai(create_chaiscript_stdlib(), create_chaiscript_parser(), modulepaths, usepaths);

  chai.add(chaiscript::fun(&myexit), "exit");
  chai.add(chaiscript::fun(&myexit), "quit");
  chai.add(chaiscript::fun(&help), "help");
  chai.add(chaiscript::fun(&throws_exception), "throws_exception");
  chai.add(chaiscript::fun(&get_eval_error), "get_eval_error");
  chai.add(chaiscript::fun(&now), "now");

  bool eval_error_ok = false;
  bool boxed_exception_ok = false;
  bool any_exception_ok = false;

  for (int i = 0; i < argc; ++i) {
    if (i == 0 && argc > 1) {
      ++i;
    }

    std::string arg(i != 0 ? argv[i] : "--interactive");

    enum {
      eInteractive,
      eCommand,
      eFile
    } mode
        = eCommand;

    if (arg == "-c" || arg == "--command") {
      if ((i + 1) >= argc) {
        std::cout << "insufficient input following " << arg << '\n';
        return EXIT_FAILURE;
      }
      arg = argv[++i];

    } else if (arg == "-" || arg == "--stdin") {
      arg = "";
      std::string line;
      while (std::getline(std::cin, line)) {
        arg += line + '\n';
      }
    } else if (arg == "-v" || arg == "--version") {
      arg = "print(version())";
    } else if (arg == "-h" || arg == "--help") {
      arg = "help(-1)";
    } else if (arg == "-e" || arg == "--evalerrorok") {
      eval_error_ok = true;
      continue;
    } else if (arg == "--exception") {
      boxed_exception_ok = true;
      continue;
    } else if (arg == "--any-exception") {
      any_exception_ok = true;
      continue;
    } else if (arg == "-i" || arg == "--interactive") {
      mode = eInteractive;
    } else if (arg.find('-') == 0) {
      std::cout << "unrecognised argument " << arg << '\n';
      return EXIT_FAILURE;
    } else {
      mode = eFile;
    }

    try {
      switch (mode) {
        case eInteractive:
          interactive(chai);
          break;
        case eCommand:
          chai.eval(arg);
          break;
        case eFile:
          chai.eval_file(arg);
      }
    } catch (const chaiscript::exception::eval_error &ee) {
      std::cout << ee.pretty_print();
      std::cout << '\n';

      if (!eval_error_ok) {
        return EXIT_FAILURE;
      }
    } catch (const chaiscript::Boxed_Value &e) {
      std::cout << "Unhandled exception thrown of type " << e.get_type_info().name() << '\n';

      if (!boxed_exception_ok) {
        return EXIT_FAILURE;
      }
    } catch (const chaiscript::exception::load_module_error &e) {
      std::cout << "Unhandled module load error\n"
                << e.what() << '\n';
    } catch (std::exception &e) {
      std::cout << "Unhandled standard exception: " << e.what() << '\n';
      if (!any_exception_ok) {
        throw;
      }
    } catch (...) {
      std::cout << "Unhandled unknown exception" << '\n';
      if (!any_exception_ok) {
        throw;
      }
    }
  }

  return EXIT_SUCCESS;
}